

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_attr_set_string_vector(exr_context_t ctxt,int part_index,char *name,int32_t size,char **val)

{
  uint uVar1;
  exr_result_t eVar2;
  size_t sVar3;
  uint in_ECX;
  exr_attribute_list_t *in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  exr_attr_string_vector_t *in_R8;
  exr_attribute_t **unaff_retaddr;
  int32_t i_3;
  int32_t i_2;
  size_t curlen;
  int32_t i_1;
  int32_t i;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  exr_attribute_t *attr;
  char *in_stack_ffffffffffffff88;
  char *s;
  ushort uVar4;
  uint in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar5;
  exr_context_t in_stack_ffffffffffffffa0;
  uint local_58;
  int local_54;
  uint in_stack_ffffffffffffffc0;
  undefined4 uVar6;
  exr_const_context_t ctxt_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  exr_result_t local_4;
  
  ctxt_00 = (exr_const_context_t)0x0;
  uVar6 = 0;
  if (in_RDI == (_internal_exr_context *)0x0) {
    local_4 = 2;
  }
  else {
    internal_exr_lock(in_RDI);
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      internal_exr_unlock(in_RDI);
      local_4 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else if (in_RDI->mode == '\0') {
      internal_exr_unlock(in_RDI);
      local_4 = (*in_RDI->standard_error)(in_RDI,8);
    }
    else if (in_RDI->mode == '\x03') {
      internal_exr_unlock(in_RDI);
      local_4 = (*in_RDI->standard_error)(in_RDI,0x15);
    }
    else if ((int)in_ECX < 0) {
      internal_exr_unlock(in_RDI);
      local_4 = (*in_RDI->print_error)
                          (in_RDI,3,"Invalid size (%d) for string vector \'%s\'",(ulong)in_ECX,
                           in_RDX);
    }
    else if (in_R8 == (exr_attr_string_vector_t *)0x0) {
      internal_exr_unlock(in_RDI);
      local_4 = (*in_RDI->print_error)
                          (in_RDI,3,
                           "No input string values for setting \'%s\', type \'stringvector\'",in_RDX
                          );
    }
    else {
      local_4 = exr_attr_list_find_by_name
                          (ctxt_00,(exr_attribute_list_t *)CONCAT44(uVar6,in_stack_ffffffffffffffc0)
                           ,(char *)in_RDI,(exr_attribute_t **)in_RDI->parts[(int)in_ESI]);
      if (local_4 == 0xf) {
        if (in_RDI->mode != '\x01') {
          internal_exr_unlock(in_RDI);
          return local_4;
        }
        s = &stack0xffffffffffffffc8;
        local_4 = exr_attr_list_add((exr_context_t)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX
                                    ,(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                    (exr_attribute_type_t)((ulong)in_R8 >> 0x20),(int32_t)in_R8,
                                    (uint8_t **)ctxt_00,unaff_retaddr);
        if (local_4 == 0) {
          local_4 = exr_attr_string_vector_init
                              (ctxt_00,(exr_attr_string_vector_t *)(ulong)in_stack_ffffffffffffffc0,
                               (int32_t)((ulong)in_RDI >> 0x20));
        }
        local_54 = 0;
        while( true ) {
          uVar1 = in_stack_ffffffffffffff94 & 0xffffff;
          if (local_4 == 0) {
            uVar1 = CONCAT13(local_54 < (int)in_ECX,(int3)in_stack_ffffffffffffff94);
          }
          in_stack_ffffffffffffff94 = uVar1;
          if ((char)(in_stack_ffffffffffffff94 >> 0x18) == '\0') break;
          local_4 = exr_attr_string_vector_set_entry
                              (in_stack_ffffffffffffffa0,
                               (exr_attr_string_vector_t *)
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                               in_stack_ffffffffffffff94,s);
          local_54 = local_54 + 1;
        }
      }
      else if (local_4 == 0) {
        if (*(int *)(ctxt_00 + 0x14) != 0x14) {
          internal_exr_unlock(in_RDI);
          eVar2 = (*in_RDI->print_error)
                            (in_RDI,0x10,
                             "\'%s\' requested type \'stringvector\', but attribute is type \'%s\'",
                             in_RDX,*(undefined8 *)(ctxt_00 + 8));
          return eVar2;
        }
        if ((**(uint **)(ctxt_00 + 0x18) == in_ECX) && (0 < *(int *)(*(long *)(ctxt_00 + 0x18) + 4))
           ) {
          if (in_RDI->mode == '\x01') {
            iVar5 = 0;
            while( true ) {
              uVar4 = (ushort)(byte)in_stack_ffffffffffffff94;
              if (local_4 == 0) {
                uVar4 = CONCAT11(iVar5 < (int)in_ECX,(byte)in_stack_ffffffffffffff94);
              }
              in_stack_ffffffffffffff94 = CONCAT22((short)(in_stack_ffffffffffffff94 >> 0x10),uVar4)
              ;
              if ((char)(uVar4 >> 8) == '\0') break;
              local_4 = exr_attr_string_vector_set_entry
                                  (in_stack_ffffffffffffffa0,
                                   (exr_attr_string_vector_t *)
                                   CONCAT44(iVar5,in_stack_ffffffffffffff98),
                                   in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
              iVar5 = iVar5 + 1;
            }
          }
          else {
            for (local_58 = 0; local_4 == 0 && (int)local_58 < (int)in_ECX; local_58 = local_58 + 1)
            {
              if (*(long *)(&in_R8->n_strings + (long)(int)local_58 * 2) == 0) {
                internal_exr_unlock(in_RDI);
                eVar2 = (*in_RDI->print_error)
                                  (in_RDI,3,"\'%s\' received NULL string in string vector",in_RDX);
                return eVar2;
              }
              sVar3 = strlen(*(char **)(&in_R8->n_strings + (long)(int)local_58 * 2));
              uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
              if (sVar3 != (long)*(int *)(*(long *)(*(long *)(ctxt_00 + 0x18) + 8) +
                                         (long)(int)local_58 * 0x10)) {
                internal_exr_unlock(in_RDI);
                eVar2 = (*in_RDI->print_error)
                                  (in_RDI,3,
                                   "\'%s\' string %d in string vector is different size (old %d new %d), unable to update"
                                   ,in_RDX,(ulong)local_58,
                                   (ulong)*(uint *)(*(long *)(*(long *)(ctxt_00 + 0x18) + 8) +
                                                   (long)(int)local_58 * 0x10),
                                   CONCAT44(uVar6,(int)sVar3));
                return eVar2;
              }
              local_4 = exr_attr_string_vector_set_entry_with_length
                                  ((exr_context_t)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),in_R8,
                                   (int32_t)((ulong)ctxt_00 >> 0x20),
                                   (char *)CONCAT44(local_4,in_stack_ffffffffffffffc0),
                                   (int32_t)((ulong)in_RDI >> 0x20));
            }
          }
        }
        else {
          if (in_RDI->mode != '\x01') {
            internal_exr_unlock(in_RDI);
            eVar2 = (*in_RDI->print_error)
                              (in_RDI,0x14,
                               "Existing string vector \'%s\' has %d strings, but given %d, unable to change"
                               ,in_RDX,(ulong)**(uint **)(ctxt_00 + 0x18),(ulong)in_ECX);
            return eVar2;
          }
          iVar5 = 0;
          while( true ) {
            uVar1 = in_stack_ffffffffffffff94 & 0xffffff00;
            if (local_4 == 0) {
              uVar1 = CONCAT31((int3)(in_stack_ffffffffffffff94 >> 8),iVar5 < (int)in_ECX);
            }
            in_stack_ffffffffffffff94 = uVar1;
            if ((char)in_stack_ffffffffffffff94 == '\0') break;
            local_4 = exr_attr_string_vector_set_entry
                                (in_stack_ffffffffffffffa0,
                                 (exr_attr_string_vector_t *)
                                 CONCAT44(in_stack_ffffffffffffff9c,iVar5),in_stack_ffffffffffffff94
                                 ,in_stack_ffffffffffffff88);
            iVar5 = iVar5 + 1;
          }
        }
      }
      internal_exr_unlock(in_RDI);
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_set_string_vector (
    exr_context_t ctxt,
    int           part_index,
    const char*   name,
    int32_t       size,
    const char**  val)
{
    exr_attribute_t* attr = NULL;
    exr_result_t     rv   = EXR_ERR_SUCCESS;

    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (pctxt->mode == EXR_CONTEXT_READ)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));
    if (pctxt->mode == EXR_CONTEXT_WRITING_DATA)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_ALREADY_WROTE_ATTRS));

    if (size < 0)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid size (%d) for string vector '%s'",
            size,
            name));

    if (!val)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No input string values for setting '%s', type 'stringvector'",
            name));

    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);

    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        if (pctxt->mode != EXR_CONTEXT_WRITE)
            return EXR_UNLOCK_AND_RETURN_PCTXT (rv);

        rv = exr_attr_list_add (
            ctxt,
            &(part->attributes),
            name,
            EXR_ATTR_STRING_VECTOR,
            0,
            NULL,
            &(attr));
        if (rv == EXR_ERR_SUCCESS)
            rv = exr_attr_string_vector_init (ctxt, attr->stringvector, size);
        for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
            rv = exr_attr_string_vector_set_entry (
                ctxt, attr->stringvector, i, val[i]);
    }
    else if (rv == EXR_ERR_SUCCESS)
    {
        if (attr->type != EXR_ATTR_STRING_VECTOR)
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'%s' requested type 'stringvector', but attribute is type '%s'",
                name,
                attr->type_name));
        if (attr->stringvector->n_strings == size &&
            attr->stringvector->alloc_size > 0)
        {
            if (pctxt->mode != EXR_CONTEXT_WRITE)
            {
                for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
                {
                    size_t curlen;
                    if (!val[i])
                        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                            pctxt,
                            EXR_ERR_INVALID_ARGUMENT,
                            "'%s' received NULL string in string vector",
                            name));

                    curlen = strlen (val[i]);
                    if (curlen !=
                        (size_t) attr->stringvector->strings[i].length)
                        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                            pctxt,
                            EXR_ERR_INVALID_ARGUMENT,
                            "'%s' string %d in string vector is different size (old %d new %d), unable to update",
                            name,
                            i,
                            attr->stringvector->strings[i].length,
                            (int32_t) curlen));

                    rv = exr_attr_string_vector_set_entry_with_length (
                        ctxt, attr->stringvector, i, val[i], (int32_t) curlen);
                }
            }
            else
            {
                for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
                    rv = exr_attr_string_vector_set_entry (
                        ctxt, attr->stringvector, i, val[i]);
            }
        }
        else if (pctxt->mode != EXR_CONTEXT_WRITE)
        {
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_MODIFY_SIZE_CHANGE,
                "Existing string vector '%s' has %d strings, but given %d, unable to change",
                name,
                attr->stringvector->n_strings,
                size));
        }
        else
        {
            for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
                rv = exr_attr_string_vector_set_entry (
                    ctxt, attr->stringvector, i, val[i]);
        }
    }
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}